

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

MinVarInfo * __thiscall
adios2::format::BP5Deserializer::MinBlocksInfo
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,size_t WriterRank,size_t BlockID)

{
  int iVar1;
  DataType Type;
  BP5VarRec *VarRec;
  size_t *psVar2;
  iterator __position;
  MinMaxStruct *this_00;
  const_iterator cVar3;
  MinVarInfo *pMVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  size_type __n;
  ulong Step_00;
  undefined8 *puVar8;
  vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *this_01;
  iterator iVar9;
  size_t Step;
  unsigned_long Step_01;
  ulong uVar10;
  byte bVar11;
  MinBlockInfo local_88;
  
  bVar11 = 0;
  local_88._0_8_ = Var;
  cVar3 = std::
          _Hashtable<void_*,_std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->VarByKey)._M_h,(key_type *)&local_88);
  VarRec = *(BP5VarRec **)
            ((long)cVar3.
                   super__Node_iterator_base<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false>
                   ._M_cur + 0x10);
  pMVar4 = (MinVarInfo *)operator_new(0x38);
  psVar2 = VarRec->GlobalDims;
  pMVar4->Dims = (int)VarRec->DimCount;
  pMVar4->Shape = psVar2;
  pMVar4->IsValue = false;
  pMVar4->IsReverseDims = false;
  this_01 = &pMVar4->BlocksInfo;
  std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
            (this_01,(initializer_list<adios2::MinBlockInfo>)ZEXT816(0),(allocator_type *)&local_88)
  ;
  Step_01 = RelStep;
  if (this->m_RandomAccessMode == true) {
    Step_01 = (VarRec->AbsStepFromRel).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[RelStep];
  }
  if (this->m_FlattenSteps == true) {
    uVar10 = ((long)(this->m_ControlArray).
                    super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_ControlArray).
                    super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    Step_01 = 0;
  }
  else {
    uVar10 = Step_01 + 1;
  }
  pMVar4->Step = RelStep;
  iVar1 = (int)VarRec->DimCount;
  pMVar4->Dims = iVar1;
  pMVar4->Shape = (size_t *)0x0;
  pMVar4->IsReverseDims = this->m_WriterIsRowMajor != this->m_ReaderIsRowMajor && 1 < iVar1;
  pMVar4->WasLocalValue = VarRec->OrigShapeID == LocalValue;
  if (Step_01 < uVar10) {
    __n = 0;
    Step_00 = Step_01;
    do {
      pvVar5 = GetMetadataBase(this,VarRec,Step_00,WriterRank);
      if (pvVar5 != (void *)0x0) {
        if (pMVar4->Shape == (size_t *)0x0) {
          pMVar4->Shape = *(size_t **)((long)pvVar5 + 0x18);
        }
        __n = __n + 1;
      }
      Step_00 = Step_00 + 1;
    } while (uVar10 != Step_00);
    std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::reserve(this_01,__n);
    if (Step_01 < uVar10) {
      do {
        pvVar5 = GetMetadataBase(this,VarRec,Step_01,WriterRank);
        if (pvVar5 != (void *)0x0) {
          if (VarRec->MinMaxOffset == 0xffffffffffffffff) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)((long)pvVar5 + VarRec->MinMaxOffset);
          }
          this_00 = (MinMaxStruct *)((long)&local_88 + 0x20);
          lVar6 = (long)pMVar4->Dims * BlockID;
          local_88.Start = (size_t *)(*(long *)((long)pvVar5 + 0x28) + lVar6 * 8);
          if (*(long *)((long)pvVar5 + 0x28) == 0) {
            local_88.Start = (size_t *)0x0;
          }
          local_88.Count = (size_t *)(*(long *)((long)pvVar5 + 0x20) + lVar6 * 8);
          if (*(long *)((long)pvVar5 + 0x20) == 0) {
            local_88.Count = (size_t *)0x0;
          }
          local_88.BufferP = (void *)0x0;
          local_88.WriterID = (int)WriterRank;
          local_88.BlockID = BlockID;
          MinMaxStruct::Init(this_00,VarRec->Type);
          if (lVar7 != 0) {
            iVar1 = VarRec->ElementSize;
            Type = VarRec->Type;
            ApplyElementMinMax(this_00,Type,(void *)(BlockID * 2 * (long)iVar1 + lVar7));
            ApplyElementMinMax(this_00,Type,(void *)((long)iVar1 * (BlockID * 2 + 1) + lVar7));
          }
          __position._M_current =
               (pMVar4->BlocksInfo).
               super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pMVar4->BlocksInfo).
              super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<adios2::MinBlockInfo,std::allocator<adios2::MinBlockInfo>>::
            _M_realloc_insert<adios2::MinBlockInfo_const&>
                      ((vector<adios2::MinBlockInfo,std::allocator<adios2::MinBlockInfo>> *)this_01,
                       __position,&local_88);
          }
          else {
            puVar8 = (undefined8 *)&local_88;
            iVar9._M_current = __position._M_current;
            for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
              *(undefined8 *)iVar9._M_current = *puVar8;
              puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
              iVar9._M_current = iVar9._M_current + (ulong)bVar11 * -0x10 + 8;
            }
            (pMVar4->BlocksInfo).
            super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        Step_01 = Step_01 + 1;
      } while (uVar10 != Step_01);
    }
  }
  else {
    std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::reserve(this_01,0);
  }
  return pMVar4;
}

Assistant:

MinVarInfo *BP5Deserializer::MinBlocksInfo(const VariableBase &Var, size_t RelStep,
                                           size_t WriterRank, size_t BlockID)
{
    // this is only called for global and local arrays, so limited
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);

    MinVarInfo *MV = new MinVarInfo((int)VarRec->DimCount, VarRec->GlobalDims);

    size_t AbsStep = RelStep;
    size_t StepLoopStart, StepLoopEnd;

    if (m_RandomAccessMode)
    {
        AbsStep = VarRec->AbsStepFromRel[RelStep];
    }
    if (m_FlattenSteps)
    {
        StepLoopStart = 0;
        StepLoopEnd = m_ControlArray.size();
    }
    else
    {
        StepLoopStart = AbsStep;
        StepLoopEnd = AbsStep + 1;
    }
    size_t Id = 0;
    MV->Step = RelStep;
    MV->Dims = (int)VarRec->DimCount;
    MV->Shape = NULL;
    MV->IsReverseDims = ((MV->Dims > 1) && (m_WriterIsRowMajor != m_ReaderIsRowMajor));

    MV->WasLocalValue = (VarRec->OrigShapeID == ShapeID::LocalValue);
    if ((VarRec->OrigShapeID == ShapeID::LocalValue) ||
        (VarRec->OrigShapeID == ShapeID::GlobalValue))
    {
        // Throw
    }
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
        if (writer_meta_base)
        {
            if (MV->Shape == NULL)
            {
                MV->Shape = writer_meta_base->Shape;
            }
            Id += 1; // one block
        }
    }
    MV->BlocksInfo.reserve(Id);

    Id = BlockID;
    for (size_t Step = StepLoopStart; Step < StepLoopEnd; Step++)
    {
        MetaArrayRec *writer_meta_base = (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);

        if (!writer_meta_base)
            continue;
        size_t WriterBlockCount = MV->Dims ? writer_meta_base->DBCount / MV->Dims : 1;
        if (BlockID >= WriterBlockCount)
        {
            // throw
        }
        MinMaxStruct *MMs = NULL;
        if (VarRec->MinMaxOffset != SIZE_MAX)
        {
            MMs = *(MinMaxStruct **)(((char *)writer_meta_base) + VarRec->MinMaxOffset);
        }
        size_t *Offsets = NULL;
        size_t *Count = NULL;
        if (writer_meta_base->Offsets)
            Offsets = writer_meta_base->Offsets + (BlockID * MV->Dims);
        if (writer_meta_base->Count)
            Count = writer_meta_base->Count + (BlockID * MV->Dims);
        MinBlockInfo Blk;
        Blk.WriterID = (int)WriterRank;
        Blk.BlockID = Id;
        Blk.Start = Offsets;
        Blk.Count = Count;
        Blk.MinMax.Init(VarRec->Type);
        if (MMs)
        {
            char *BlockMinAddr = (((char *)MMs) + 2 * BlockID * VarRec->ElementSize);
            char *BlockMaxAddr = (((char *)MMs) + (2 * BlockID + 1) * VarRec->ElementSize);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMinAddr);
            ApplyElementMinMax(Blk.MinMax, VarRec->Type, (void *)BlockMaxAddr);
        }
        // Blk.BufferP
        MV->BlocksInfo.push_back(Blk);
    }
    return MV;
}